

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O3

void de::cmdline::selfTest(void)

{
  char **ppcVar1;
  pointer_____offset_0x10___ *ppuVar2;
  undefined8 uVar3;
  char *pcVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  int iVar7;
  Entry *pEVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  long lVar12;
  CommandLine cmdLine;
  Parser parser_1;
  Parser parser;
  ostringstream err;
  char *args [1];
  undefined1 local_2b0 [8];
  _Rb_tree_node_base local_2a8;
  NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_280;
  Option<de::cmdline::TestIntOpt> local_268;
  Parser local_230;
  Option<de::cmdline::TestBoolOpt> local_218;
  Option<de::cmdline::TestStringOpt> local_1e0 [2];
  ios_base local_170 [264];
  Option<de::cmdline::TestNamedOpt> local_68;
  
  detail::Parser::Parser((Parser *)&local_218);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  local_2a8._0_8_ = (ulong)(uint)local_2a8._4_4_ << 0x20;
  local_2a8._M_parent = (_Base_ptr)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  bVar6 = detail::Parser::parse
                    ((Parser *)&local_218,0,(char **)0x0,(CommandLine *)local_2b0,
                     (ostream *)local_1e0);
  if (bVar6) {
    std::__cxx11::stringbuf::str();
    pcVar4 = local_268.longName;
    if ((char **)local_268.shortName != &local_268.description) {
      operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
    }
    if (pcVar4 != (char *)0x0) goto LAB_002022b8;
  }
  else {
LAB_002022b8:
    deAssertFail("parseOk && err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x166);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  local_68.shortName = "-h";
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Base_ptr)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  bVar6 = detail::Parser::parse
                    ((Parser *)&local_218,1,&local_68.shortName,(CommandLine *)local_2b0,
                     (ostream *)local_1e0);
  if (bVar6) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x16f);
  }
  std::__cxx11::stringbuf::str();
  pcVar4 = local_268.longName;
  ppcVar1 = &local_268.description;
  if ((char **)local_268.shortName != ppcVar1) {
    operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
  }
  if (pcVar4 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x170);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  local_68.shortName = "--help";
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Base_ptr)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  bVar6 = detail::Parser::parse
                    ((Parser *)&local_218,1,&local_68.shortName,(CommandLine *)local_2b0,
                     (ostream *)local_1e0);
  if (bVar6) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x179);
  }
  std::__cxx11::stringbuf::str();
  pcVar4 = local_268.longName;
  if ((char **)local_268.shortName != ppcVar1) {
    operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
  }
  if (pcVar4 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x17a);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Base_ptr)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  bVar6 = detail::Parser::parse
                    ((Parser *)&local_218,3,(char **)&DAT_00274c40,(CommandLine *)local_2b0,
                     (ostream *)local_1e0);
  if (bVar6) {
    std::__cxx11::stringbuf::str();
    if ((char **)local_268.shortName != ppcVar1) {
      operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
    }
    if (local_268.longName == (char *)0x0) goto LAB_002025b1;
  }
  deAssertFail("parseOk && err.str().empty()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
               ,0x183);
LAB_002025b1:
  if ((long)vStack_280.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)vStack_280.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x60) {
    deAssertFail("cmdLine.getArgs().size() == DE_LENGTH_OF_ARRAY(args)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x184);
  }
  lVar12 = 0;
  do {
    iVar7 = std::__cxx11::string::compare
                      ((char *)((long)&((vStack_280.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar12));
    if (iVar7 != 0) {
      deAssertFail("cmdLine.getArgs()[ndx] == args[ndx]",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x187);
    }
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0x60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  if (local_218.shortName != (char *)0x0) {
    operator_delete(local_218.shortName,(long)local_218.description - (long)local_218.shortName);
  }
  detail::Parser::Parser(&local_230);
  local_1e0[0].shortName = "s";
  local_1e0[0].longName = "string";
  local_1e0[0].description = "String option";
  local_1e0[0].defaultValue = (char *)0x0;
  local_1e0[0].parse = parseType<std::__cxx11::string>;
  local_1e0[0].namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_1e0[0].namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  detail::Parser::addOption<de::cmdline::TestStringOpt>(&local_230,local_1e0);
  ppcVar1 = &local_268.description;
  local_2b0 = (undefined1  [8])0x23d1ed;
  local_2a8._0_8_ = "xyz";
  local_2a8._M_parent = (_Base_ptr)0x23ceda;
  local_2a8._M_left = (_Base_ptr)0x23fecf;
  local_2a8._M_right = (_Base_ptr)parseType<std::__cxx11::string>;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  detail::Parser::addOption<de::cmdline::TestStringDefOpt>
            (&local_230,(Option<de::cmdline::TestStringDefOpt> *)local_2b0);
  local_268.shortName = "i";
  local_268.longName = "int";
  local_268.description = "Int option";
  local_268.defaultValue = (char *)0x0;
  local_268.parse = parseType<int>;
  local_268.namedValues = (NamedValue<int> *)0x0;
  local_268.namedValuesEnd = (NamedValue<int> *)0x0;
  detail::Parser::addOption<de::cmdline::TestIntOpt>(&local_230,&local_268);
  local_218.shortName = "b";
  local_218.longName = "bool";
  local_218.description = "Test boolean flag";
  local_218.defaultValue = (char *)0x0;
  local_218.parse = parseType<bool>;
  local_218.namedValues = (NamedValue<bool> *)0x0;
  local_218.namedValuesEnd = (NamedValue<bool> *)0x0;
  detail::Parser::addOption<de::cmdline::TestBoolOpt>(&local_230,&local_218);
  local_68.shortName = "n";
  local_68.longName = "named";
  local_68.description = "Test named opt";
  local_68.defaultValue = "one";
  local_68.parse = (ParseFunc)0x0;
  local_68.namedValues = selfTest::s_namedValues;
  local_68.namedValuesEnd = (NamedValue<unsigned_long> *)&PTR_anon_var_dwarf_30ca1f_00274c90;
  detail::Parser::addOption<de::cmdline::TestNamedOpt>(&local_230,&local_68);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  std::__cxx11::stringbuf::str();
  uVar3 = local_2a8._0_8_;
  if (local_2b0 != (undefined1  [8])&local_2a8._M_parent) {
    operator_delete((void *)local_2b0,(ulong)((long)&(local_2a8._M_parent)->_M_color + 1));
  }
  if ((char *)uVar3 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x19e);
  }
  detail::Parser::help(&local_230,(ostream *)local_1e0);
  std::__cxx11::stringbuf::str();
  uVar3 = local_2a8._0_8_;
  if (local_2b0 != (undefined1  [8])&local_2a8._M_parent) {
    operator_delete((void *)local_2b0,(ulong)((long)&(local_2a8._M_parent)->_M_color + 1));
  }
  if ((char *)uVar3 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Rb_tree_node_base *)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  bVar6 = detail::Parser::parse
                    (&local_230,0,(char **)0x0,(CommandLine *)local_2b0,(ostream *)local_1e0);
  if (!bVar6) {
    deAssertFail("parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1a9);
  }
  std::__cxx11::stringbuf::str();
  pcVar4 = local_268.longName;
  if ((char **)local_268.shortName != ppcVar1) {
    operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
  }
  if (pcVar4 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1aa);
  }
  p_Var11 = &local_2a8;
  p_Var5 = local_2a8._M_parent;
  if (local_2a8._M_parent != (_Rb_tree_node_base *)0x0) {
    do {
      p_Var9 = p_Var5;
      p_Var10 = p_Var11;
      ppuVar2 = *(pointer_____offset_0x10___ **)(p_Var9 + 1);
      p_Var11 = p_Var9;
      if (ppuVar2 < &TestStringOpt::typeinfo) {
        p_Var11 = p_Var10;
      }
      p_Var5 = (&p_Var9->_M_left)[ppuVar2 < &TestStringOpt::typeinfo];
    } while ((&p_Var9->_M_left)[ppuVar2 < &TestStringOpt::typeinfo] != (_Base_ptr)0x0);
    if (p_Var11 != &local_2a8) {
      if (ppuVar2 < &TestStringOpt::typeinfo) {
        p_Var9 = p_Var10;
      }
      if (*(ulong *)(p_Var9 + 1) < 0x274d61) {
        deAssertFail("!cmdLine.hasOption<TestStringOpt>()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                     ,0x1ac);
      }
    }
    p_Var5 = local_2a8._M_parent;
    p_Var11 = &local_2a8;
    if (local_2a8._M_parent != (_Rb_tree_node_base *)0x0) {
      do {
        p_Var10 = p_Var11;
        p_Var9 = p_Var5;
        ppuVar2 = *(pointer_____offset_0x10___ **)(p_Var9 + 1);
        p_Var11 = p_Var9;
        if (ppuVar2 < &TestIntOpt::typeinfo) {
          p_Var11 = p_Var10;
        }
        p_Var5 = (&p_Var9->_M_left)[ppuVar2 < &TestIntOpt::typeinfo];
      } while ((&p_Var9->_M_left)[ppuVar2 < &TestIntOpt::typeinfo] != (_Base_ptr)0x0);
      if (p_Var11 != &local_2a8) {
        if (ppuVar2 < &TestIntOpt::typeinfo) {
          p_Var9 = p_Var10;
        }
        if (*(ulong *)(p_Var9 + 1) < 0x274d81) {
          deAssertFail("!cmdLine.hasOption<TestIntOpt>()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                       ,0x1ad);
        }
      }
    }
  }
  pEVar8 = detail::TypedFieldMap::get
                     ((TypedFieldMap *)local_2b0,(type_info *)&TestNamedOpt::typeinfo);
  if (*pEVar8->value != 1) {
    deAssertFail("cmdLine.getOption<TestNamedOpt>() == 1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1ae);
  }
  pEVar8 = detail::TypedFieldMap::get
                     ((TypedFieldMap *)local_2b0,(type_info *)&TestBoolOpt::typeinfo);
  if (*pEVar8->value != '\0') {
    deAssertFail("cmdLine.getOption<TestBoolOpt>() == false",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1af);
  }
  pEVar8 = detail::TypedFieldMap::get
                     ((TypedFieldMap *)local_2b0,(type_info *)&TestStringDefOpt::typeinfo);
  iVar7 = std::__cxx11::string::compare((char *)pEVar8->value);
  if (iVar7 != 0) {
    deAssertFail("cmdLine.getOption<TestStringDefOpt>() == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1b0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Base_ptr)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  bVar6 = detail::Parser::parse
                    (&local_230,5,&PTR_anon_var_dwarf_30ca1f_00274c90,(CommandLine *)local_2b0,
                     (ostream *)local_1e0);
  if (!bVar6) {
    deAssertFail("parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1ba);
  }
  std::__cxx11::stringbuf::str();
  pcVar4 = local_268.longName;
  if ((char **)local_268.shortName != ppcVar1) {
    operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
  }
  if (pcVar4 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1bb);
  }
  pEVar8 = detail::TypedFieldMap::get
                     ((TypedFieldMap *)local_2b0,(type_info *)&TestStringOpt::typeinfo);
  iVar7 = std::__cxx11::string::compare((char *)pEVar8->value);
  if (iVar7 != 0) {
    deAssertFail("cmdLine.getOption<TestStringOpt>() == \"test value\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1bd);
  }
  pEVar8 = detail::TypedFieldMap::get((TypedFieldMap *)local_2b0,(type_info *)&TestIntOpt::typeinfo)
  ;
  if (*pEVar8->value != 9) {
    deAssertFail("cmdLine.getOption<TestIntOpt>() == 9",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1be);
  }
  pEVar8 = detail::TypedFieldMap::get
                     ((TypedFieldMap *)local_2b0,(type_info *)&TestBoolOpt::typeinfo);
  if (*pEVar8->value == '\0') {
    deAssertFail("cmdLine.getOption<TestBoolOpt>()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1bf);
  }
  pEVar8 = detail::TypedFieldMap::get
                     ((TypedFieldMap *)local_2b0,(type_info *)&TestNamedOpt::typeinfo);
  if (*pEVar8->value != -1) {
    deAssertFail("cmdLine.getOption<TestNamedOpt>() == ~0ull",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1c0);
  }
  pEVar8 = detail::TypedFieldMap::get
                     ((TypedFieldMap *)local_2b0,(type_info *)&TestStringDefOpt::typeinfo);
  iVar7 = std::__cxx11::string::compare((char *)pEVar8->value);
  if (iVar7 != 0) {
    deAssertFail("cmdLine.getOption<TestStringDefOpt>() == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1c1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Rb_tree_node_base *)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  bVar6 = detail::Parser::parse
                    (&local_230,5,&PTR_anon_var_dwarf_30caa6_00274cc0,(CommandLine *)local_2b0,
                     (ostream *)local_1e0);
  if (!bVar6) {
    deAssertFail("parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1cb);
  }
  std::__cxx11::stringbuf::str();
  pcVar4 = local_268.longName;
  if ((char **)local_268.shortName != ppcVar1) {
    operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
  }
  if (pcVar4 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1cc);
  }
  pEVar8 = detail::TypedFieldMap::get
                     ((TypedFieldMap *)local_2b0,(type_info *)&TestStringOpt::typeinfo);
  iVar7 = std::__cxx11::string::compare((char *)pEVar8->value);
  if (iVar7 != 0) {
    deAssertFail("cmdLine.getOption<TestStringOpt>() == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1ce);
  }
  pEVar8 = detail::TypedFieldMap::get
                     ((TypedFieldMap *)local_2b0,(type_info *)&TestBoolOpt::typeinfo);
  if (*pEVar8->value == '\0') {
    deAssertFail("cmdLine.getOption<TestBoolOpt>()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1cf);
  }
  p_Var5 = local_2a8._M_parent;
  p_Var11 = &local_2a8;
  if (local_2a8._M_parent != (_Rb_tree_node_base *)0x0) {
    do {
      p_Var10 = p_Var11;
      p_Var9 = p_Var5;
      ppuVar2 = *(pointer_____offset_0x10___ **)(p_Var9 + 1);
      p_Var11 = p_Var9;
      if (ppuVar2 < &TestIntOpt::typeinfo) {
        p_Var11 = p_Var10;
      }
      p_Var5 = (&p_Var9->_M_left)[ppuVar2 < &TestIntOpt::typeinfo];
    } while ((&p_Var9->_M_left)[ppuVar2 < &TestIntOpt::typeinfo] != (_Base_ptr)0x0);
    if (p_Var11 != &local_2a8) {
      if (ppuVar2 < &TestIntOpt::typeinfo) {
        p_Var9 = p_Var10;
      }
      if (*(ulong *)(p_Var9 + 1) < 0x274d81) {
        deAssertFail("!cmdLine.hasOption<TestIntOpt>()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                     ,0x1d0);
      }
    }
  }
  if ((long)vStack_280.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)vStack_280.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x40) {
    deAssertFail("cmdLine.getArgs().size() == 2",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1d2);
  }
  iVar7 = std::__cxx11::string::compare
                    ((char *)vStack_280.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if (iVar7 != 0) {
    deAssertFail("cmdLine.getArgs()[0] == \"--int=2\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1d3);
  }
  iVar7 = std::__cxx11::string::compare
                    ((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &(vStack_280.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_string_length)->field_2).
                     _M_local_buf + 8);
  if (iVar7 != 0) {
    deAssertFail("cmdLine.getArgs()[1] == \"-b\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1d4);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Rb_tree_node_base *)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  bVar6 = detail::Parser::parse
                    (&local_230,4,(char **)&DAT_00274cf0,(CommandLine *)local_2b0,
                     (ostream *)local_1e0);
  if (!bVar6) {
    deAssertFail("parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1de);
  }
  std::__cxx11::stringbuf::str();
  pcVar4 = local_268.longName;
  if ((char **)local_268.shortName != ppcVar1) {
    operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
  }
  if (pcVar4 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1df);
  }
  pEVar8 = detail::TypedFieldMap::get
                     ((TypedFieldMap *)local_2b0,(type_info *)&TestStringOpt::typeinfo);
  iVar7 = std::__cxx11::string::compare((char *)pEVar8->value);
  if (iVar7 != 0) {
    deAssertFail("cmdLine.getOption<TestStringOpt>() == \"--\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1e1);
  }
  pEVar8 = detail::TypedFieldMap::get
                     ((TypedFieldMap *)local_2b0,(type_info *)&TestBoolOpt::typeinfo);
  if (*pEVar8->value == '\0') {
    deAssertFail("cmdLine.getOption<TestBoolOpt>()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1e2);
  }
  p_Var5 = local_2a8._M_parent;
  p_Var11 = &local_2a8;
  if (local_2a8._M_parent != (_Rb_tree_node_base *)0x0) {
    do {
      p_Var10 = p_Var11;
      p_Var9 = p_Var5;
      ppuVar2 = *(pointer_____offset_0x10___ **)(p_Var9 + 1);
      p_Var11 = p_Var9;
      if (ppuVar2 < &TestIntOpt::typeinfo) {
        p_Var11 = p_Var10;
      }
      p_Var5 = (&p_Var9->_M_left)[ppuVar2 < &TestIntOpt::typeinfo];
    } while ((&p_Var9->_M_left)[ppuVar2 < &TestIntOpt::typeinfo] != (_Base_ptr)0x0);
    if (p_Var11 != &local_2a8) {
      if (ppuVar2 < &TestIntOpt::typeinfo) {
        p_Var9 = p_Var10;
      }
      if (*(ulong *)(p_Var9 + 1) < 0x274d81) {
        deAssertFail("!cmdLine.hasOption<TestIntOpt>()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                     ,0x1e3);
      }
    }
  }
  if ((long)vStack_280.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)vStack_280.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    deAssertFail("cmdLine.getArgs().size() == 1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1e5);
  }
  iVar7 = std::__cxx11::string::compare
                    ((char *)vStack_280.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if (iVar7 != 0) {
    deAssertFail("cmdLine.getArgs()[0] == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1e6);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  local_218.shortName = "-b=true";
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Base_ptr)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  bVar6 = detail::Parser::parse
                    (&local_230,1,&local_218.shortName,(CommandLine *)local_2b0,(ostream *)local_1e0
                    );
  if (bVar6) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1f0);
  }
  std::__cxx11::stringbuf::str();
  pcVar4 = local_268.longName;
  if ((char **)local_268.shortName != ppcVar1) {
    operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
  }
  if (pcVar4 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1f1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  local_218.shortName = "-n=two";
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Base_ptr)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  bVar6 = detail::Parser::parse
                    (&local_230,1,&local_218.shortName,(CommandLine *)local_2b0,(ostream *)local_1e0
                    );
  if (bVar6) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1fb);
  }
  std::__cxx11::stringbuf::str();
  pcVar4 = local_268.longName;
  if ((char **)local_268.shortName != ppcVar1) {
    operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
  }
  if (pcVar4 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x1fc);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  local_218.shortName = "-x";
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Base_ptr)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  bVar6 = detail::Parser::parse
                    (&local_230,1,&local_218.shortName,(CommandLine *)local_2b0,(ostream *)local_1e0
                    );
  if (bVar6) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x206);
  }
  std::__cxx11::stringbuf::str();
  pcVar4 = local_268.longName;
  if ((char **)local_268.shortName != ppcVar1) {
    operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
  }
  if (pcVar4 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x207);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  local_218.shortName = "--xxx";
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Base_ptr)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  bVar6 = detail::Parser::parse
                    (&local_230,1,&local_218.shortName,(CommandLine *)local_2b0,(ostream *)local_1e0
                    );
  if (bVar6) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x211);
  }
  std::__cxx11::stringbuf::str();
  pcVar4 = local_268.longName;
  if ((char **)local_268.shortName != ppcVar1) {
    operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
  }
  if (pcVar4 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x212);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Base_ptr)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  bVar6 = detail::Parser::parse
                    (&local_230,2,&PTR_anon_var_dwarf_30cb64_00274d10,(CommandLine *)local_2b0,
                     (ostream *)local_1e0);
  if (bVar6) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x21c);
  }
  std::__cxx11::stringbuf::str();
  pcVar4 = local_268.longName;
  if ((char **)local_268.shortName != ppcVar1) {
    operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
  }
  if (pcVar4 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x21d);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Base_ptr)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  bVar6 = detail::Parser::parse
                    (&local_230,2,&PTR_anon_var_dwarf_30cb7a_00274d20,(CommandLine *)local_2b0,
                     (ostream *)local_1e0);
  if (bVar6) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x227);
  }
  std::__cxx11::stringbuf::str();
  pcVar4 = local_268.longName;
  if ((char **)local_268.shortName != ppcVar1) {
    operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
  }
  if (pcVar4 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x228);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  local_218.shortName = "--int";
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Base_ptr)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  bVar6 = detail::Parser::parse
                    (&local_230,1,&local_218.shortName,(CommandLine *)local_2b0,(ostream *)local_1e0
                    );
  if (bVar6) {
    deAssertFail("!parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x232);
  }
  std::__cxx11::stringbuf::str();
  pcVar4 = local_268.longName;
  if ((char **)local_268.shortName != ppcVar1) {
    operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
  }
  if (pcVar4 == (char *)0x0) {
    deAssertFail("!err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x233);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._M_parent = (_Base_ptr)0x0;
  local_288 = (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_280.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_left = &local_2a8;
  local_2a8._M_right = &local_2a8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  bVar6 = detail::Parser::parse
                    (&local_230,4,&PTR_anon_var_dwarf_30cb90_00274d30,(CommandLine *)local_2b0,
                     (ostream *)local_1e0);
  if (!bVar6) {
    deAssertFail("parseOk",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x23d);
  }
  std::__cxx11::stringbuf::str();
  pcVar4 = local_268.longName;
  if ((char **)local_268.shortName != ppcVar1) {
    operator_delete(local_268.shortName,(ulong)(local_268.description + 1));
  }
  if (pcVar4 != (char *)0x0) {
    deAssertFail("err.str().empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x23e);
  }
  pEVar8 = detail::TypedFieldMap::get
                     ((TypedFieldMap *)local_2b0,(type_info *)&TestStringOpt::typeinfo);
  iVar7 = std::__cxx11::string::compare((char *)pEVar8->value);
  if (iVar7 != 0) {
    deAssertFail("cmdLine.getOption<TestStringOpt>() == \"\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x23f);
  }
  pEVar8 = detail::TypedFieldMap::get
                     ((TypedFieldMap *)local_2b0,(type_info *)&TestStringDefOpt::typeinfo);
  iVar7 = std::__cxx11::string::compare((char *)pEVar8->value);
  if (iVar7 != 0) {
    deAssertFail("cmdLine.getOption<TestStringDefOpt>() == \"\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x240);
  }
  pEVar8 = detail::TypedFieldMap::get
                     ((TypedFieldMap *)local_2b0,(type_info *)&TestBoolOpt::typeinfo);
  if (*pEVar8->value == '\0') {
    deAssertFail("cmdLine.getOption<TestBoolOpt>()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                 ,0x241);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_280);
  detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_2b0);
  if (local_230.m_options.
      super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.m_options.
                    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_230.m_options.
                          super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.m_options.
                          super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void selfTest (void)
{
	// Parsing with no options.
	{
		Parser parser;

		{
			std::ostringstream	err;
			CommandLine			cmdLine;
			const bool			parseOk		= parser.parse(0, DE_NULL, &cmdLine, err);

			DE_TEST_ASSERT(parseOk && err.str().empty());
		}

		{
			const char*			args[]		= { "-h" };
			std::ostringstream	err;
			CommandLine			cmdLine;
			const bool			parseOk		= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(err.str().empty()); // No message about -h
		}

		{
			const char*			args[]		= { "--help" };
			std::ostringstream	err;
			CommandLine			cmdLine;
			const bool			parseOk		= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(err.str().empty()); // No message about -h
		}

		{
			const char*			args[]		= { "foo", "bar", "baz baz" };
			std::ostringstream	err;
			CommandLine			cmdLine;
			const bool			parseOk		= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk && err.str().empty());
			DE_TEST_ASSERT(cmdLine.getArgs().size() == DE_LENGTH_OF_ARRAY(args));

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(args); ndx++)
				DE_TEST_ASSERT(cmdLine.getArgs()[ndx] == args[ndx]);
		}
	}

	// Parsing with options.
	{
		Parser parser;

		static const NamedValue<deUint64> s_namedValues[] =
		{
			{ "zero",	0		},
			{ "one",	1		},
			{ "huge",	~0ull	}
		};

		parser << Option<TestStringOpt>		("s",	"string",	"String option")
			   << Option<TestStringDefOpt>	("x",	"xyz",		"String option w/ default value",	"foo")
			   << Option<TestIntOpt>		("i",	"int",		"Int option")
			   << Option<TestBoolOpt>		("b",	"bool",		"Test boolean flag")
			   << Option<TestNamedOpt>		("n",	"named",	"Test named opt",	DE_ARRAY_BEGIN(s_namedValues),	DE_ARRAY_END(s_namedValues),	"one");

		{
			std::ostringstream err;
			DE_TEST_ASSERT(err.str().empty());
			parser.help(err);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Default values
		{
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(0, DE_NULL, &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());

			DE_TEST_ASSERT(!cmdLine.hasOption<TestStringOpt>());
			DE_TEST_ASSERT(!cmdLine.hasOption<TestIntOpt>());
			DE_TEST_ASSERT(cmdLine.getOption<TestNamedOpt>() == 1);
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>() == false);
			DE_TEST_ASSERT(cmdLine.getOption<TestStringDefOpt>() == "foo");
		}

		// Basic parsing
		{
			const char*			args[]	= { "-s", "test value", "-b", "-i=9", "--named=huge" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());

			DE_TEST_ASSERT(cmdLine.getOption<TestStringOpt>() == "test value");
			DE_TEST_ASSERT(cmdLine.getOption<TestIntOpt>() == 9);
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>());
			DE_TEST_ASSERT(cmdLine.getOption<TestNamedOpt>() == ~0ull);
			DE_TEST_ASSERT(cmdLine.getOption<TestStringDefOpt>() == "foo");
		}

		// End of argument list (--)
		{
			const char*			args[]	= { "--string=foo", "-b", "--", "--int=2", "-b" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());

			DE_TEST_ASSERT(cmdLine.getOption<TestStringOpt>() == "foo");
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>());
			DE_TEST_ASSERT(!cmdLine.hasOption<TestIntOpt>());

			DE_TEST_ASSERT(cmdLine.getArgs().size() == 2);
			DE_TEST_ASSERT(cmdLine.getArgs()[0] == "--int=2");
			DE_TEST_ASSERT(cmdLine.getArgs()[1] == "-b");
		}

		// Value --
		{
			const char*			args[]	= { "--string", "--", "-b", "foo" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());

			DE_TEST_ASSERT(cmdLine.getOption<TestStringOpt>() == "--");
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>());
			DE_TEST_ASSERT(!cmdLine.hasOption<TestIntOpt>());

			DE_TEST_ASSERT(cmdLine.getArgs().size() == 1);
			DE_TEST_ASSERT(cmdLine.getArgs()[0] == "foo");
		}

		// Invalid flag usage
		{
			const char*			args[]	= { "-b=true" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Invalid named option
		{
			const char*			args[]	= { "-n=two" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Unrecognized option (-x)
		{
			const char*			args[]	= { "-x" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Unrecognized option (--xxx)
		{
			const char*			args[]	= { "--xxx" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Invalid int value
		{
			const char*			args[]	= { "--int", "1x" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Arg specified multiple times
		{
			const char*			args[]	= { "-s=2", "-s=3" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Missing value
		{
			const char*			args[]	= { "--int" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Empty value --arg=
		{
			const char*			args[]	= { "--string=", "-b", "-x", "" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());
			DE_TEST_ASSERT(cmdLine.getOption<TestStringOpt>() == "");
			DE_TEST_ASSERT(cmdLine.getOption<TestStringDefOpt>() == "");
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>());
		}
	}
}